

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_test.cpp
# Opt level: O3

XrResult LayerTestXrCreateApiLayerInstance
                   (XrInstanceCreateInfo *info,XrApiLayerCreateInfo *apiLayerInfo,
                   XrInstance *instance)

{
  mapped_type p_Var1;
  XrResult XVar2;
  mapped_type *pp_Var3;
  XrApiLayerCreateInfo local_240;
  
  memcpy(&local_240,apiLayerInfo,0x218);
  local_240.nextInfo = apiLayerInfo->nextInfo->next;
  XVar2 = (*apiLayerInfo->nextInfo->nextCreateApiLayerInstance)(info,&local_240,instance);
  if (XR_ERROR_VALIDATION_FAILURE < XVar2) {
    p_Var1 = (mapped_type)apiLayerInfo->nextInfo->nextGetInstanceProcAddr;
    pp_Var3 = std::
              map<XrInstance_T_*,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)()),_std::less<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)())>_>_>
              ::operator[](&g_next_gipa_map,instance);
    *pp_Var3 = p_Var1;
    XVar2 = XR_SUCCESS;
  }
  return XVar2;
}

Assistant:

static XRAPI_ATTR XrResult XRAPI_CALL LayerTestXrCreateApiLayerInstance(const XrInstanceCreateInfo *info,
                                                                        const XrApiLayerCreateInfo *apiLayerInfo,
                                                                        XrInstance *instance) {
    // Call down to the next layer's xrCreateApiLayerInstance.
    // Clone the XrApiLayerCreateInfo, but move to the next XrApiLayerNextInfo in the chain. nextInfo will be null
    // if the loader's terminator function is going to be called (between the layer and the runtime) but this is OK
    // because the loader's terminator function won't use it.
    XrApiLayerCreateInfo newApiLayerInfo = *apiLayerInfo;
    newApiLayerInfo.nextInfo = apiLayerInfo->nextInfo->next;

    const XrResult res = apiLayerInfo->nextInfo->nextCreateApiLayerInstance(info, &newApiLayerInfo, instance);
    if (XR_FAILED(res)) {
        return res;  // The next layer's xrCreateApiLayerInstance failed.
    }

    g_next_gipa_map[*instance] = apiLayerInfo->nextInfo->nextGetInstanceProcAddr;

    return XR_SUCCESS;
}